

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O3

void P_SpawnSpecials(void)

{
  line_t_conflict *line_00;
  double dVar1;
  extsector_t *this;
  line_t_conflict *plVar2;
  uint uVar3;
  DThinker *origin;
  DWallLightTransfer *this_00;
  DLightTransfer *pDVar4;
  bool tolines;
  ushort uVar5;
  sector_t_conflict *psVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  undefined8 in_RSI;
  sector_t_conflict *psVar11;
  uint uVar12;
  line_t_conflict *line;
  double dVar13;
  FSectorTagIterator itr;
  TThinkerIterator<ASkyCamCompat> it2;
  DVector2 local_68;
  double local_50;
  FThinkerIterator local_48;
  
  P_SetupPortals();
  if (0 < numsectors) {
    iVar8 = 0;
    psVar6 = sectors;
    iVar10 = numsectors;
    do {
      if (psVar6->special != 0) {
        P_InitSectorSpecial((sector_t *)psVar6,(int)in_RSI);
        iVar10 = numsectors;
      }
      iVar8 = iVar8 + 1;
      psVar6 = psVar6 + 1;
    } while (iVar8 < iVar10);
  }
  ProcessEDSectors();
  P_SpawnScrollers();
  if (0 < numlines) {
    piVar7 = lines->args + 1;
    iVar8 = 0;
    iVar10 = numlines;
    do {
      if (piVar7[-2] == 0xdb) {
        iVar10 = *piVar7;
        if (iVar10 == 0) {
          dVar13 = c_sqrt(*(double *)(piVar7 + -6) * *(double *)(piVar7 + -6) +
                          ((DVector2 *)(piVar7 + -8))->X * ((DVector2 *)(piVar7 + -8))->X);
          iVar10 = (int)dVar13;
        }
        else if (199 < iVar10) {
          iVar10 = 200;
        }
        P_SetSectorFriction(piVar7[-1],iVar10,false);
        piVar7[-2] = 0;
        iVar10 = numlines;
      }
      iVar8 = iVar8 + 1;
      piVar7 = piVar7 + 0x26;
    } while (iVar8 < iVar10);
  }
  P_SpawnPushers();
  FThinkerIterator::FThinkerIterator(&local_48,ASkyCamCompat::RegistrationInfo.MyClass,0x80);
  origin = FThinkerIterator::Next(&local_48,false);
  if (origin != (DThinker *)0x0) {
    do {
      P_SpawnSkybox((ASkyViewpoint *)origin);
      origin = FThinkerIterator::Next(&local_48,false);
    } while (origin != (DThinker *)0x0);
  }
  if (0 < numlines) {
    lVar9 = 0;
    do {
      plVar2 = lines;
      line_00 = lines + lVar9;
      iVar10 = lines[lVar9].special;
      if (iVar10 < 0x9c) {
        if (iVar10 < 0x33) {
          if (iVar10 == 0x10) {
            this_00 = (DWallLightTransfer *)
                      M_Malloc_Dbg(0x48,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
            DWallLightTransfer::DWallLightTransfer
                      (this_00,(sector_t *)lines[lVar9].frontsector,lines[lVar9].args[0],
                       (BYTE)lines[lVar9].args[1]);
          }
          else if (iVar10 == 0x30) {
            P_Attach3dMidtexLinesToSector
                      (line_00->frontsector,line_00->args[0],line_00->args[1],line_00->args[2] != 0)
            ;
          }
        }
        else if (iVar10 == 0x33) {
          if (line_00->args[0] == 0) {
            P_AddSectorLinks(line_00->frontsector,line_00->args[1],line_00->args[2],line_00->args[3]
                            );
          }
        }
        else if (iVar10 == 0x39) {
          iVar10 = line_00->args[1];
          if (((iVar10 == 6) || (iVar10 == 0)) && (line_00->args[3] == 0)) {
            P_SpawnPortal(line_00,line_00->args[0],line_00->args[2],line_00->args[4],iVar10);
          }
          else if (iVar10 - 3U < 2) {
            local_68.X = 0.0;
            local_68.Y = 0.0;
            tolines = false;
            uVar3 = P_GetPortal(iVar10 == 3 ^ 5,line_00->args[2],line_00->frontsector,
                                (sector_t_conflict *)0x0,&local_68);
            CopyPortal(line_00->args[0],line_00->args[2],uVar3,0.0,tolines);
          }
        }
      }
      else if (iVar10 < 0xd1) {
        if (iVar10 == 0x9c) {
          P_SpawnLinePortal(line_00);
        }
        else if (iVar10 == 0xbe) {
          iVar10 = line_00->args[1];
          if (iVar10 < 3) {
            if (iVar10 == 0) {
              dVar13 = (line_00->delta).X;
              dVar1 = (line_00->delta).Y;
              local_50 = c_sqrt(dVar1 * dVar1 + dVar13 * dVar13);
              local_50 = local_50 / 100.0;
              iVar10 = lines[lVar9].args[0];
              if (iVar10 == 0) {
                iVar8 = 0;
              }
              else {
                iVar8 = tagManager.TagHashFirst[(byte)iVar10];
              }
              local_68.X = (double)CONCAT44(iVar8,iVar10);
              uVar3 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
              while (-1 < (int)uVar3) {
                sectors[uVar3].gravity = local_50;
                uVar3 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
              }
            }
            else if (iVar10 == 2) {
              dVar13 = (line_00->delta).X;
              dVar1 = (line_00->delta).Y;
              local_50 = c_sqrt(dVar1 * dVar1 + dVar13 * dVar13);
              iVar10 = lines[lVar9].args[0];
              if (iVar10 == 0) {
                iVar8 = 0;
              }
              else {
                iVar8 = tagManager.TagHashFirst[(byte)iVar10];
              }
              local_68.X = (double)CONCAT44(iVar8,iVar10);
              uVar3 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
              if (-1 < (int)uVar3) {
                uVar12 = (uint)local_50;
                do {
                  psVar6 = sectors;
                  sectors[uVar3].damageamount = uVar12;
                  psVar6[uVar3].damagetype.super_FName.Index = 0;
                  if ((int)uVar12 < 0x14) {
                    psVar6[uVar3].damageinterval = 0x20;
                    psVar6[uVar3].leakydamage = 0;
                  }
                  else if (uVar12 < 0x32) {
                    psVar6[uVar3].damageinterval = 0x20;
                    psVar6[uVar3].leakydamage = 5;
                  }
                  else {
                    psVar6[uVar3].damageinterval = 1;
                    psVar6[uVar3].leakydamage = 0x100;
                  }
                  uVar3 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
                } while (-1 < (int)uVar3);
              }
            }
          }
          else if (iVar10 == 3) {
            if (line_00->args[3] == 0) {
              P_AddSectorLinksByID(line_00->frontsector,line_00->args[0],line_00->args[2]);
            }
          }
          else if (iVar10 == 0xff) {
            iVar10 = lines[lVar9].args[0];
            if (iVar10 == 0) {
              iVar8 = 0;
            }
            else {
              iVar8 = tagManager.TagHashFirst[(byte)iVar10];
            }
            local_68.X = (double)CONCAT44(iVar8,iVar10);
            uVar3 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
            if (-1 < (int)uVar3) {
              do {
                sectors[uVar3].sky = (int)lVar9 + 1U | 0x40000000;
                uVar3 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
              } while (-1 < (int)uVar3);
            }
          }
        }
      }
      else if (iVar10 == 0xd3) {
        pDVar4 = (DLightTransfer *)
                 M_Malloc_Dbg(0x48,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                              ,0x1f9);
        DLightTransfer::DLightTransfer
                  (pDVar4,(sector_t *)lines[lVar9].frontsector,lines[lVar9].args[0],false);
      }
      else if (iVar10 == 0xd2) {
        pDVar4 = (DLightTransfer *)
                 M_Malloc_Dbg(0x48,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                              ,0x1f9);
        DLightTransfer::DLightTransfer
                  (pDVar4,(sector_t *)lines[lVar9].frontsector,lines[lVar9].args[0],true);
      }
      else if (iVar10 == 0xd1) {
        psVar6 = line_00->frontsector;
        uVar3 = line_00->args[1];
        if ((uVar3 & 2) != 0) {
          *(byte *)&psVar6->MoreFlags = (byte)psVar6->MoreFlags | 2;
        }
        if ((uVar3 & 4) != 0) {
          *(byte *)&psVar6->MoreFlags = (byte)psVar6->MoreFlags | 4;
        }
        uVar5 = 0x20;
        if (((uVar3 & 8) != 0) || (uVar5 = 0x40, forcewater.Value == true)) {
          psVar6->MoreFlags = psVar6->MoreFlags | uVar5;
        }
        if ((uVar3 & 0x10) != 0) {
          *(byte *)&psVar6->MoreFlags = (byte)psVar6->MoreFlags | 0x10;
        }
        if ((uVar3 & 0x20) != 0) {
          *(byte *)&psVar6->MoreFlags = (byte)psVar6->MoreFlags | 8;
        }
        iVar10 = plVar2[lVar9].args[0];
        if (iVar10 == 0) {
          iVar8 = 0;
        }
        else {
          iVar8 = tagManager.TagHashFirst[(byte)iVar10];
        }
        local_68.X = (double)CONCAT44(iVar8,iVar10);
        while (uVar3 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68), -1 < (int)uVar3) {
          sectors[uVar3].heightsec = psVar6;
          this = psVar6->e;
          psVar11 = sectors + uVar3;
          TArray<sector_t_*,_sector_t_*>::Grow((TArray<sector_t_*,_sector_t_*> *)this,1);
          uVar12 = (this->FakeFloor).Sectors.Count;
          (this->FakeFloor).Sectors.Array[uVar12] = psVar11;
          (this->FakeFloor).Sectors.Count = uVar12 + 1;
          sector_t::AdjustFloorClip((sector_t *)(sectors + uVar3));
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < numlines);
  }
  FBehavior::StaticStartTypedScripts(1,(AActor *)0x0,false,0,false);
  return;
}

Assistant:

void P_SpawnSpecials (void)
{
	sector_t *sector;
	int i;

	P_SetupPortals();

	//	Init special SECTORs.
	sector = sectors;
	for (i = 0; i < numsectors; i++, sector++)
	{
		if (sector->special == 0)
			continue;

		P_InitSectorSpecial(sector, sector->special);
	}

#ifndef NO_EDATA
	ProcessEDSectors();
#endif

	
	// Init other misc stuff

	P_SpawnScrollers(); // killough 3/7/98: Add generalized scrollers
	P_SpawnFriction();	// phares 3/12/98: New friction model using linedefs
	P_SpawnPushers();	// phares 3/20/98: New pusher model using linedefs

	TThinkerIterator<ASkyCamCompat> it2;
	ASkyCamCompat *pt2;
	while ((pt2 = it2.Next()))
	{
		P_SpawnSkybox(pt2);
	}

	for (i = 0; i < numlines; i++)
	{
		switch (lines[i].special)
		{
			int s;
			sector_t *sec;

		// killough 3/7/98:
		// support for drawn heights coming from different sector
		case Transfer_Heights:
			{
				sec = lines[i].frontsector;
				if (lines[i].args[1] & 2)
				{
					sec->MoreFlags |= SECF_FAKEFLOORONLY;
				}
				if (lines[i].args[1] & 4)
				{
					sec->MoreFlags |= SECF_CLIPFAKEPLANES;
				}
				if (lines[i].args[1] & 8)
				{
					sec->MoreFlags |= SECF_UNDERWATER;
				}
				else if (forcewater)
				{
					sec->MoreFlags |= SECF_FORCEDUNDERWATER;
				}
				if (lines[i].args[1] & 16)
				{
					sec->MoreFlags |= SECF_IGNOREHEIGHTSEC;
				}
				if (lines[i].args[1] & 32)
				{
					sec->MoreFlags |= SECF_NOFAKELIGHT;
				}
				FSectorTagIterator itr(lines[i].args[0]);
				while ((s = itr.Next()) >= 0)
				{
					sectors[s].heightsec = sec;
					sec->e->FakeFloor.Sectors.Push(&sectors[s]);
					sectors[s].AdjustFloorClip();
				}
				break;
			}

		// killough 3/16/98: Add support for setting
		// floor lighting independently (e.g. lava)
		case Transfer_FloorLight:
			new DLightTransfer (lines[i].frontsector, lines[i].args[0], true);
			break;

		// killough 4/11/98: Add support for setting
		// ceiling lighting independently
		case Transfer_CeilingLight:
			new DLightTransfer (lines[i].frontsector, lines[i].args[0], false);
			break;

		// [Graf Zahl] Add support for setting lighting
		// per wall independently
		case Transfer_WallLight:
			new DWallLightTransfer (lines[i].frontsector, lines[i].args[0], lines[i].args[1]);
			break;

		case Sector_Attach3dMidtex:
			P_Attach3dMidtexLinesToSector(lines[i].frontsector, lines[i].args[0], lines[i].args[1], !!lines[i].args[2]);
			break;

		case Sector_SetLink:
			if (lines[i].args[0] == 0)
			{
				P_AddSectorLinks(lines[i].frontsector, lines[i].args[1], lines[i].args[2], lines[i].args[3]);
			}
			break;

		case Sector_SetPortal:
			// arg 0 = sector tag
			// arg 1 = type
			//	- 0: normal (handled here)
			//	- 1: copy (handled by the portal they copy)
			//	- 2: EE-style skybox (handled by the camera object)
			//  - 3: EE-style flat portal (GZDoom HW renderer only for now)
			//  - 4: EE-style horizon portal (GZDoom HW renderer only for now)
			//  - 5: copy portal to line (GZDoom HW renderer only for now)
			//  - 6: linked portal
			//	other values reserved for later use
			// arg 2 = 0:floor, 1:ceiling, 2:both
			// arg 3 = 0: anchor, 1: reference line
			// arg 4 = for the anchor only: alpha
			if ((lines[i].args[1] == 0 || lines[i].args[1] == 6) && lines[i].args[3] == 0)
			{
				P_SpawnPortal(&lines[i], lines[i].args[0], lines[i].args[2], lines[i].args[4], lines[i].args[1]);
			}
			else if (lines[i].args[1] == 3 || lines[i].args[1] == 4)
			{
				line_t *line = &lines[i];
				unsigned pnum = P_GetPortal(line->args[1] == 3 ? PORTS_PLANE : PORTS_HORIZON, line->args[2], line->frontsector, NULL, { 0,0 });
				CopyPortal(line->args[0], line->args[2], pnum, 0, true);
			}
			break;

		case Line_SetPortal:
			P_SpawnLinePortal(&lines[i]);
			break;

		// [RH] ZDoom Static_Init settings
		case Static_Init:
			switch (lines[i].args[1])
			{
			case Init_Gravity:
				{
					double grav = lines[i].Delta().Length() / 100.;
					FSectorTagIterator itr(lines[i].args[0]);
					while ((s = itr.Next()) >= 0)
						sectors[s].gravity = grav;
				}
				break;

			//case Init_Color:
			// handled in P_LoadSideDefs2()

			case Init_Damage:
				{
					int damage = int(lines[i].Delta().Length());
					FSectorTagIterator itr(lines[i].args[0]);
					while ((s = itr.Next()) >= 0)
					{
						sector_t *sec = &sectors[s];
						sec->damageamount = damage;
						sec->damagetype = NAME_None;
						if (sec->damageamount < 20)
						{
							sec->leakydamage = 0;
							sec->damageinterval = 32;
						}
						else if (sec->damageamount < 50)
						{
							sec->leakydamage = 5;
							sec->damageinterval = 32;
						}
						else
						{
							sec->leakydamage = 256;
							sec->damageinterval = 1;
						}
					}
				}
				break;

			case Init_SectorLink:
				if (lines[i].args[3] == 0)
					P_AddSectorLinksByID(lines[i].frontsector, lines[i].args[0], lines[i].args[2]);
				break;

			// killough 10/98:
			//
			// Support for sky textures being transferred from sidedefs.
			// Allows scrolling and other effects (but if scrolling is
			// used, then the same sector tag needs to be used for the
			// sky sector, the sky-transfer linedef, and the scroll-effect
			// linedef). Still requires user to use F_SKY1 for the floor
			// or ceiling texture, to distinguish floor and ceiling sky.

			case Init_TransferSky:
				{
					FSectorTagIterator itr(lines[i].args[0]);
					while ((s = itr.Next()) >= 0)
						 sectors[s].sky = (i + 1) | PL_SKYFLAT; 
					break;
				}
			}
			break;
		}
	}
	// [RH] Start running any open scripts on this map
	FBehavior::StaticStartTypedScripts (SCRIPT_Open, NULL, false);
}